

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileApproverTests.cpp
# Opt level: O0

string * __thiscall
anon_unknown.dwarf_c6ca2::IdenticalFilenamesNamer::getApprovedFile
          (IdenticalFilenamesNamer *this,string *extensionWithDot)

{
  string *in_RDX;
  string *in_RSI;
  string *in_RDI;
  ApprovalTestNamer namer;
  string local_40 [48];
  string *this_00;
  
  this_00 = in_RDI;
  ApprovalTests::ApprovalTestNamer::ApprovalTestNamer((ApprovalTestNamer *)in_RDI);
  std::__cxx11::string::string(local_40,in_RDX);
  ApprovalTests::ApprovalTestNamer::getApprovedFile((ApprovalTestNamer *)this_00,in_RSI);
  std::__cxx11::string::~string(local_40);
  ApprovalTests::ApprovalTestNamer::~ApprovalTestNamer((ApprovalTestNamer *)0x17a858);
  return in_RDI;
}

Assistant:

const override
        {
            ApprovalTestNamer namer;
            return namer.getApprovedFile(extensionWithDot);
        }